

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Supermap.hpp
# Opt level: O2

string * __thiscall
supermap::Supermap<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long>::addRandomString
          (string *__return_storage_ptr__,
          Supermap<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long> *this,string *s,
          size_t len)

{
  bool bVar1;
  
  std::__cxx11::string::push_back((char)s);
  while (bVar1 = len != 0, len = len - 1, bVar1) {
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::operator()(&this->random);
    std::__cxx11::string::push_back((char)s);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::string addRandomString(std::string s, std::size_t len = 8) const {
        assert(len != 0);
        s += '-';
        for (std::size_t i = 0; i < len; ++i) {
            s += static_cast<char>(random() % ('z' - 'a' + 1) + 'a');
        }
        return s;
    }